

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check_invoker
               (void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  basic_wrap_stringstream<char> local_208;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_210 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,
                  "all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30 = (pbVar2->_M_dataplus)._M_p;
  local_28 = local_30 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x32a);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_220 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,
                  "all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40 = (pbVar2->_M_dataplus)._M_p;
  local_38 = local_40 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x32a);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_230 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,
                  "all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check"
                 );
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50 = (pbVar2->_M_dataplus)._M_p;
  local_48 = local_50 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x32a);
  this = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check::
  test_method((all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check
               *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_240 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,
                  "all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60 = (pbVar2->_M_dataplus)._M_p;
  local_58 = local_60 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x32a);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_250 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,
                  "all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70 = (pbVar2->_M_dataplus)._M_p;
  local_68 = local_70 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x32a);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(all_cells_iterator_and_boundary_iterators_in_Bitmap_cubical_complex_base_check_range_check) {
  std::vector<double> expected_filtration;
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(0);
  expected_filtration.push_back(1);
  expected_filtration.push_back(1);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(3);
  expected_filtration.push_back(3);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(2);
  expected_filtration.push_back(3);
  expected_filtration.push_back(3);

  std::vector<unsigned> expected_dimension;
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(2);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);
  expected_dimension.push_back(1);
  expected_dimension.push_back(0);

  std::vector<size_t> expected_boundary;
  expected_boundary.push_back(0);
  expected_boundary.push_back(2);
  expected_boundary.push_back(2);
  expected_boundary.push_back(4);
  expected_boundary.push_back(0);
  expected_boundary.push_back(10);
  expected_boundary.push_back(1);
  expected_boundary.push_back(11);
  expected_boundary.push_back(7);
  expected_boundary.push_back(5);
  expected_boundary.push_back(2);
  expected_boundary.push_back(12);
  expected_boundary.push_back(3);
  expected_boundary.push_back(13);
  expected_boundary.push_back(9);
  expected_boundary.push_back(7);
  expected_boundary.push_back(4);
  expected_boundary.push_back(14);
  expected_boundary.push_back(10);
  expected_boundary.push_back(12);
  expected_boundary.push_back(12);
  expected_boundary.push_back(14);
  expected_boundary.push_back(10);
  expected_boundary.push_back(20);
  expected_boundary.push_back(11);
  expected_boundary.push_back(21);
  expected_boundary.push_back(17);
  expected_boundary.push_back(15);
  expected_boundary.push_back(12);
  expected_boundary.push_back(22);
  expected_boundary.push_back(13);
  expected_boundary.push_back(23);
  expected_boundary.push_back(19);
  expected_boundary.push_back(17);
  expected_boundary.push_back(14);
  expected_boundary.push_back(24);
  expected_boundary.push_back(20);
  expected_boundary.push_back(22);
  expected_boundary.push_back(22);
  expected_boundary.push_back(24);

  std::vector<size_t> expected_coboundary;
  expected_coboundary.push_back(5);
  expected_coboundary.push_back(1);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(7);
  expected_coboundary.push_back(1);
  expected_coboundary.push_back(3);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(9);
  expected_coboundary.push_back(3);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(5);
  expected_coboundary.push_back(15);
  expected_coboundary.push_back(11);
  expected_coboundary.push_back(6);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(7);
  expected_coboundary.push_back(17);
  expected_coboundary.push_back(11);
  expected_coboundary.push_back(13);
  expected_coboundary.push_back(8);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(9);
  expected_coboundary.push_back(19);
  expected_coboundary.push_back(13);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(15);
  expected_coboundary.push_back(21);
  expected_coboundary.push_back(16);
  expected_coboundary.push_back(17);
  expected_coboundary.push_back(21);
  expected_coboundary.push_back(23);
  expected_coboundary.push_back(18);
  expected_coboundary.push_back(19);
  expected_coboundary.push_back(23);

  std::vector<unsigned> sizes(2);
  sizes[0] = 2;
  sizes[1] = 2;

  std::vector<double> data(4);
  data[0] = 0;
  data[1] = 1;
  data[2] = 2;
  data[3] = 3;

  Bitmap_cubical_complex_base ba(sizes, data);
  int i = 0;
  int bd_it = 0;
  int cbd_it = 0;

  Bitmap_cubical_complex_base::All_cells_range range = ba.all_cells_range();
  for (auto it = range.begin(); it != range.end(); ++it) {
    BOOST_CHECK(expected_filtration[i] == ba.get_cell_data(*it));
    BOOST_CHECK(expected_dimension[i] == ba.get_dimension_of_a_cell(*it));

    Bitmap_cubical_complex_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin(); bd != bdrange.end(); ++bd) {
      BOOST_CHECK(expected_boundary[bd_it] == *bd);
      ++bd_it;
    }

    Bitmap_cubical_complex_base::Coboundary_range cbdrange = ba.coboundary_range(*it);
    for (auto cbd = cbdrange.begin(); cbd != cbdrange.end(); ++cbd) {
      BOOST_CHECK(expected_coboundary[cbd_it] == *cbd);
      ++cbd_it;
    }
    ++i;
  }
}